

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_1::PosixEnv::GetTestDirectory(PosixEnv *this,string *result)

{
  __uid_t _Var1;
  string *in_RDX;
  long *in_RSI;
  char *in_RDI;
  char buf [100];
  char *env;
  Status *in_stack_ffffffffffffff50;
  undefined1 local_90 [8];
  Status local_88 [13];
  char *local_20;
  string *local_18;
  
  local_18 = in_RDX;
  local_20 = getenv("TEST_TMPDIR");
  if ((local_20 == (char *)0x0) || (*local_20 == '\0')) {
    in_stack_ffffffffffffff50 = local_88;
    _Var1 = geteuid();
    snprintf((char *)in_stack_ffffffffffffff50,100,"/tmp/leveldbtest-%d",(ulong)_Var1);
    std::__cxx11::string::operator=(local_18,(char *)local_88);
  }
  else {
    std::__cxx11::string::operator=(local_18,local_20);
  }
  (**(code **)(*in_RSI + 0x48))(local_90,in_RSI,local_18);
  Status::~Status(in_stack_ffffffffffffff50);
  Status::OK();
  return (Status)in_RDI;
}

Assistant:

Status GetTestDirectory(std::string* result) override {
    const char* env = std::getenv("TEST_TMPDIR");
    if (env && env[0] != '\0') {
      *result = env;
    } else {
      char buf[100];
      std::snprintf(buf, sizeof(buf), "/tmp/leveldbtest-%d",
                    static_cast<int>(::geteuid()));
      *result = buf;
    }

    // The CreateDir status is ignored because the directory may already exist.
    CreateDir(*result);

    return Status::OK();
  }